

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,void **vtt)

{
  long *__s;
  void *pvVar1;
  
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[9];
  TPZVec<int>::TPZVec(&(this->fSideOrient).super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 0;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018b5098;
  __s = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = __s;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 6;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 5) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x2c) = 0xffffffff;
  this->fhdivfam = EHDivStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  memset(__s,0xff,0xa8);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv() :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}